

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::alloc_temp_regs(size_t prec,size_t cnt,...)

{
  uint uVar1;
  CVmBigNumCacheReg *pCVar2;
  uint uVar3;
  bool bVar4;
  CVmBigNumCache *pCVar5;
  char in_AL;
  undefined8 *puVar6;
  char *pcVar7;
  undefined8 *puVar8;
  undefined8 in_RCX;
  ulong uVar9;
  long *plVar10;
  undefined8 in_RDX;
  size_t sVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list marker;
  undefined8 local_e8 [5];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  marker[0].overflow_arg_area = &stack0x00000008;
  uVar3 = 0x10;
  sVar11 = cnt;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_e8[4] = in_R8;
  local_c0 = in_R9;
  bVar12 = false;
  while (bVar4 = bVar12, bVar12 = sVar11 != 0, sVar11 = sVar11 - 1, bVar12) {
    uVar9 = (ulong)uVar3;
    if (uVar9 < 0x29) {
      puVar8 = *(undefined8 **)((long)local_e8 + uVar9);
      uVar1 = uVar3 + 8;
      if (0x20 < uVar3) goto LAB_002307b9;
      puVar6 = (undefined8 *)((long)local_e8 + uVar9 + 8);
      uVar3 = uVar3 + 0x10;
    }
    else {
      puVar8 = *marker[0].overflow_arg_area;
      marker[0].overflow_arg_area = (void *)((long)marker[0].overflow_arg_area + 8);
      uVar1 = uVar3;
LAB_002307b9:
      puVar6 = (undefined8 *)marker[0].overflow_arg_area;
      marker[0].overflow_arg_area = (void *)((long)marker[0].overflow_arg_area + 8);
      uVar3 = uVar1;
    }
    pcVar7 = alloc_temp_reg(prec,(uint *)*puVar6);
    *puVar8 = pcVar7;
    bVar12 = true;
    if (pcVar7 != (char *)0x0) {
      bVar12 = bVar4;
    }
  }
  if (!bVar4) {
    return;
  }
  marker[0].overflow_arg_area = &stack0x00000008;
  uVar3 = 0x10;
  do {
    pCVar5 = S_bignum_cache;
    bVar12 = cnt == 0;
    cnt = cnt - 1;
    if (bVar12) {
      err_throw(0xa28);
    }
    uVar9 = (ulong)uVar3;
    if (uVar9 < 0x29) {
      plVar10 = *(long **)((long)local_e8 + uVar9);
      uVar1 = uVar3 + 8;
      if (0x20 < uVar3) goto LAB_00230865;
      puVar8 = (undefined8 *)((long)local_e8 + uVar9 + 8);
      uVar3 = uVar3 + 0x10;
    }
    else {
      plVar10 = *marker[0].overflow_arg_area;
      marker[0].overflow_arg_area = (void *)((long)marker[0].overflow_arg_area + 8);
      uVar1 = uVar3;
LAB_00230865:
      puVar8 = (undefined8 *)marker[0].overflow_arg_area;
      marker[0].overflow_arg_area = (void *)((long)marker[0].overflow_arg_area + 8);
      uVar3 = uVar1;
    }
    if (*plVar10 != 0) {
      uVar1 = *(uint *)*puVar8;
      pCVar2 = S_bignum_cache->reg_;
      pCVar2[uVar1].nxt_ = S_bignum_cache->free_reg_;
      pCVar5->free_reg_ = pCVar2 + uVar1;
    }
  } while( true );
}

Assistant:

void CVmObjBigNum::alloc_temp_regs(size_t prec, size_t cnt, ...)
{
    va_list marker;
    size_t i;
    int failed;
    char **ext_ptr;
    uint *hdl_ptr;

    /* set up to read varargs */
    va_start(marker, cnt);

    /* no failures yet */
    failed = FALSE;

    /* scan the varargs list */
    for (i = 0 ; i < cnt ; ++i)
    {
        /* get the next argument */
        ext_ptr = va_arg(marker, char **);
        hdl_ptr = va_arg(marker, uint *);

        /* allocate a register */
        *ext_ptr = alloc_temp_reg(prec, hdl_ptr);

        /* if this allocation failed, note it, but keep going for now */
        if (*ext_ptr == 0)
            failed = TRUE;
    }

    /* done reading argument */
    va_end(marker);

    /* if we had any failures, free all of the registers we allocated */
    if (failed)
    {
        /* restart reading the varargs */
        va_start(marker, cnt);

        /* scan the varargs and free the successfully allocated registers */
        for (i = 0 ; i < cnt ; ++i)
        {
            /* get the next argument */
            ext_ptr = va_arg(marker, char **);
            hdl_ptr = va_arg(marker, uint *);

            /* free this register if we successfully allocated it */
            if (*ext_ptr != 0)
                release_temp_reg(*hdl_ptr);
        }

        /* done reading varargs */
        va_end(marker);

        /* throw the error */
        err_throw(VMERR_BIGNUM_NO_REGS);
    }
}